

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_large_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  iterator __position;
  void *pvVar2;
  ulong local_b8;
  size_t i_3;
  size_t half;
  size_t i_2;
  size_t i_1;
  size_t zero;
  void *p_small;
  _Self local_78;
  _Self local_70 [3];
  key_type local_58;
  char *p;
  undefined1 local_48 [4];
  int i;
  set<char_*,_std::less<char_*>,_std::allocator<char_*>_> p_set;
  char **argv_local;
  int argc_local;
  
  p_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  printf("Test malloc(0) x %d\n",0x400);
  std::set<char_*,_std::less<char_*>,_std::allocator<char_*>_>::set
            ((set<char_*,_std::less<char_*>,_std::allocator<char_*>_> *)local_48);
  p._4_4_ = 0;
  while( true ) {
    if (0x3ff < p._4_4_) {
      std::set<char_*,_std::less<char_*>,_std::allocator<char_*>_>::~set
                ((set<char_*,_std::less<char_*>,_std::allocator<char_*>_> *)local_48);
      printf("Test small malloc\n");
      pvVar2 = malloc(0x400000);
      pvVar2 = noopt<void*>(pvVar2);
      if (pvVar2 == (void *)0x0) {
        syscall(1,2,"Check failed: p_small != nullptr\n",0x21);
        abort();
      }
      printf("Test malloc(0 - N)\n");
      for (i_2 = 1; i_2 < 0x4000; i_2 = i_2 + 1) {
        TryAllocExpectFail(-i_2);
      }
      printf("Test malloc(0 - 1048576 - N)\n");
      for (half = 0; half < 0x4000; half = half + 1) {
        TryAllocExpectFail(-half - 0x100000);
      }
      printf("Test malloc(max/2 +- N)\n");
      for (local_b8 = 0; local_b8 < 0x40; local_b8 = local_b8 + 1) {
        TryAllocMightFail(0x8000000000000000 - local_b8);
        TryAllocMightFail(local_b8 + 0x8000000000000000);
      }
      printf("PASS\n");
      return 0;
    }
    local_58 = (key_type)operator_new(1);
    if (local_58 == (key_type)0x0) break;
    local_70[0]._M_node =
         (_Base_ptr)
         std::set<char_*,_std::less<char_*>,_std::allocator<char_*>_>::find
                   ((set<char_*,_std::less<char_*>,_std::allocator<char_*>_> *)local_48,&local_58);
    local_78._M_node =
         (_Base_ptr)
         std::set<char_*,_std::less<char_*>,_std::allocator<char_*>_>::end
                   ((set<char_*,_std::less<char_*>,_std::allocator<char_*>_> *)local_48);
    bVar1 = std::operator==(local_70,&local_78);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      syscall(1,2,"Check failed: p_set.find(p) == p_set.end()\n",0x2b);
      abort();
    }
    __position = std::set<char_*,_std::less<char_*>,_std::allocator<char_*>_>::end
                           ((set<char_*,_std::less<char_*>,_std::allocator<char_*>_> *)local_48);
    std::set<char_*,_std::less<char_*>,_std::allocator<char_*>_>::insert
              ((set<char_*,_std::less<char_*>,_std::allocator<char_*>_> *)local_48,
               (const_iterator)__position._M_node,&local_58);
    p._4_4_ = p._4_4_ + 1;
  }
  syscall(1,2,"Check failed: p != nullptr\n",0x1b);
  abort();
}

Assistant:

int main (int argc, char** argv) {
  // Allocate some 0-byte objects.  They better be unique.
  // 0 bytes is not large but it exercises some paths related to
  // large-allocation code.
  {
    static const int kZeroTimes = 1024;
    printf("Test malloc(0) x %d\n", kZeroTimes);
    set<char*> p_set;
    for ( int i = 0; i < kZeroTimes; ++i ) {
      char* p = new char;
      CHECK(p != nullptr);
      CHECK(p_set.find(p) == p_set.end());
      p_set.insert(p_set.end(), p);
    }
    // Just leak the memory.
  }

  // Grab some memory so that some later allocations are guaranteed to fail.
  printf("Test small malloc\n");
  void* p_small = noopt(malloc(4*1048576));
  CHECK(p_small != nullptr);

  // Test sizes up near the maximum size_t.
  // These allocations test the wrap-around code.
  printf("Test malloc(0 - N)\n");
  const size_t zero = 0;
  static const size_t kMinusNTimes = 16384;
  for ( size_t i = 1; i < kMinusNTimes; ++i ) {
    TryAllocExpectFail(zero - i);
  }

  // Test sizes a bit smaller.
  // The small malloc above guarantees that all these return nullptr.
  printf("Test malloc(0 - 1048576 - N)\n");
  static const size_t kMinusMBMinusNTimes = 16384;
  for ( size_t i = 0; i < kMinusMBMinusNTimes; ++i) {
    TryAllocExpectFail(zero - 1048576 - i);
  }

  // Test sizes at half of size_t.
  // These might or might not fail to allocate.
  printf("Test malloc(max/2 +- N)\n");
  static const size_t kHalfPlusMinusTimes = 64;
  const size_t half = (zero - 2) / 2 + 1;
  for ( size_t i = 0; i < kHalfPlusMinusTimes; ++i) {
    TryAllocMightFail(half - i);
    TryAllocMightFail(half + i);
  }

  printf("PASS\n");
  return 0;
}